

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

DdNode * Llb_Nonlin4CreateCube2(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  int iVar1;
  DdManager *pDVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  DdNode *pDVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  DdNode *f;
  
  pDVar2 = p->dd;
  aVar3 = pDVar2->TimeStop;
  pDVar2->TimeStop = 0;
  pDVar6 = Cudd_ReadOne(pDVar2);
  Cudd_Ref(pDVar6);
  pVVar7 = pPart1->vVars;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    f = pDVar6;
    do {
      pVVar4 = p->pVars[pVVar7->pArray[lVar8]]->vParts;
      iVar1 = pVVar4->nSize;
      if (iVar1 < 1) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                      ,0xb5,"DdNode *Llb_Nonlin4CreateCube2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)")
        ;
      }
      pDVar6 = f;
      if (iVar1 == 2) {
        piVar5 = pVVar4->pArray;
        if (((*piVar5 == pPart1->iPart) && (piVar5[1] == pPart2->iPart)) ||
           ((*piVar5 == pPart2->iPart && (piVar5[1] == pPart1->iPart)))) {
          pDVar2 = p->dd;
          pDVar6 = Cudd_bddIthVar(pDVar2,p->pVars[pVVar7->pArray[lVar8]]->iVar);
          pDVar6 = Cudd_bddAnd(pDVar2,f,pDVar6);
          Cudd_Ref(pDVar6);
          Cudd_RecursiveDeref(p->dd,f);
        }
      }
      lVar8 = lVar8 + 1;
      pVVar7 = pPart1->vVars;
      f = pDVar6;
    } while (lVar8 < pVVar7->nSize);
  }
  Cudd_Deref(pDVar6);
  p->dd->TimeStop = aVar3;
  return pDVar6;
}

Assistant:

DdNode * Llb_Nonlin4CreateCube2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    DdNode * bCube, * bTemp;
    Llb_Var_t * pVar;
    int i;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bCube = Cudd_ReadOne(p->dd);   Cudd_Ref( bCube );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        assert( Vec_IntSize(pVar->vParts) > 0 );
        if ( Vec_IntSize(pVar->vParts) != 2 )
            continue;
        if ( (Vec_IntEntry(pVar->vParts, 0) == pPart1->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart2->iPart) ||
             (Vec_IntEntry(pVar->vParts, 0) == pPart2->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart1->iPart) )
        {
            bCube = Cudd_bddAnd( p->dd, bTemp = bCube, Cudd_bddIthVar(p->dd, pVar->iVar) );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
    }
    Cudd_Deref( bCube );
    p->dd->TimeStop = TimeStop;
    return bCube;
}